

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

void tcptran_pipe_close(void *arg)

{
  nni_mtx_lock((nni_mtx *)((long)arg + 0x600));
  *(undefined1 *)((long)arg + 0x20) = 1;
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  nni_aio_close((nni_aio *)((long)arg + 0x268));
  nni_aio_close((nni_aio *)((long)arg + 0xa0));
  nni_aio_close((nni_aio *)((long)arg + 0x430));
  nng_stream_close(*arg);
  return;
}

Assistant:

static void
tcptran_pipe_close(void *arg)
{
	tcptran_pipe *p = arg;

	nni_mtx_lock(&p->mtx);
	p->closed = true;
	nni_mtx_unlock(&p->mtx);

	nni_aio_close(&p->rxaio);
	nni_aio_close(&p->txaio);
	nni_aio_close(&p->negoaio);

	nng_stream_close(p->conn);
}